

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O0

const_iterator __thiscall
VulkanHppGenerator::findStructMemberItByType
          (VulkanHppGenerator *this,string *type,
          vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>
          *memberData)

{
  borrowed_iterator_t<const_std::vector<VulkanHppGenerator::MemberData>_&> bVar1;
  vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>
  *memberData_local;
  string *type_local;
  VulkanHppGenerator *this_local;
  
  bVar1 = std::ranges::__find_if_fn::
          operator()<const_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_&,_std::identity,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_KhronosGroup[P]Vulkan_Hpp_VulkanHppGenerator_cpp:2110:44)>
                    ((__find_if_fn *)&std::ranges::find_if,memberData,type);
  return (const_iterator)bVar1._M_current;
}

Assistant:

std::vector<VulkanHppGenerator::MemberData>::const_iterator VulkanHppGenerator::findStructMemberItByType( std::string const &             type,
                                                                                                          std::vector<MemberData> const & memberData ) const
{
  return std::ranges::find_if( memberData, [&type]( MemberData const & md ) { return md.type.type == type; } );
}